

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

cf_errno_t cf_que_dequeue(cf_que_t *que,cf_void_t **data,cf_size_t *size)

{
  cf_size_t *size_local;
  cf_void_t **data_local;
  cf_que_t *que_local;
  
  if (((que == (cf_que_t *)0x0) || (data == (cf_void_t **)0x0)) || (size == (cf_size_t *)0x0)) {
    que_local._4_4_ = 2;
  }
  else if (que->empty == 1) {
    que_local._4_4_ = 6;
  }
  else {
    *data = que->items[que->head].data;
    *size = que->items[que->head].size;
    que->head = (cf_uint_t)((ulong)(que->head + 1) % que->max_size);
    if (que->head == que->tail) {
      que->empty = 1;
    }
    que_local._4_4_ = 0;
  }
  return que_local._4_4_;
}

Assistant:

cf_errno_t  cf_que_dequeue(cf_que_t* que, cf_void_t** data, cf_size_t* size) {
    if(!que || !data || size == 0) return CF_EPARAM;
    if(que->empty == CF_TRUE) return CF_EEMPTY;

    *data = que->items[que->head].data;
    *size = que->items[que->head].size;
    que->head = (que->head + 1) % que->max_size;

    if(que->head == que->tail) que->empty = CF_TRUE;
    return CF_OK;
}